

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

ON_Viewport * __thiscall ON_Viewport::ShallowCopy(ON_Viewport *this,ON_Viewport *destination)

{
  double dVar1;
  undefined8 uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  long lVar5;
  ON_Xform *pOVar6;
  ON_Xform *pOVar7;
  byte bVar8;
  
  bVar8 = 0;
  if (destination == (ON_Viewport *)0x0) {
    destination = (ON_Viewport *)operator_new(0x248);
    memset(destination,0,0x248);
    ON_Viewport(destination);
  }
  else {
    ON_Object::PurgeUserData((ON_Object *)destination);
    if (this == destination) {
      return destination;
    }
    ON_Object::operator=((ON_Object *)destination,(ON_Object *)&DefaultTopViewYUp);
    memcpy(&destination->m_bValidCamera,&DefaultTopViewYUp.m_bValidCamera,0x220);
    uVar2 = DefaultTopViewYUp.m_projection_content_sha1.m_digest._8_8_;
    *(undefined8 *)(destination->m_projection_content_sha1).m_digest =
         DefaultTopViewYUp.m_projection_content_sha1.m_digest._0_8_;
    *(undefined8 *)((destination->m_projection_content_sha1).m_digest + 8) = uVar2;
    *(undefined4 *)((destination->m_projection_content_sha1).m_digest + 0x10) =
         DefaultTopViewYUp.m_projection_content_sha1.m_digest._16_4_;
  }
  destination->m_bValidCamera = this->m_bValidCamera;
  destination->m_bValidFrustum = this->m_bValidFrustum;
  destination->m_bValidPort = this->m_bValidPort;
  destination->m_bValidCameraFrame = this->m_bValidCameraFrame;
  destination->m_projection = this->m_projection;
  destination->m_bLockCamUp = this->m_bLockCamUp;
  destination->m_bLockCamDir = this->m_bLockCamDir;
  destination->m_bLockCamLoc = this->m_bLockCamLoc;
  destination->m_frustum_symmetry_flags = this->m_frustum_symmetry_flags;
  (destination->m_CamLoc).z = (this->m_CamLoc).z;
  dVar1 = (this->m_CamLoc).y;
  (destination->m_CamLoc).x = (this->m_CamLoc).x;
  (destination->m_CamLoc).y = dVar1;
  (destination->m_CamDir).z = (this->m_CamDir).z;
  dVar1 = (this->m_CamDir).y;
  (destination->m_CamDir).x = (this->m_CamDir).x;
  (destination->m_CamDir).y = dVar1;
  (destination->m_CamUp).z = (this->m_CamUp).z;
  dVar1 = (this->m_CamUp).y;
  (destination->m_CamUp).x = (this->m_CamUp).x;
  (destination->m_CamUp).y = dVar1;
  (destination->m_CamX).z = (this->m_CamX).z;
  dVar1 = (this->m_CamX).y;
  (destination->m_CamX).x = (this->m_CamX).x;
  (destination->m_CamX).y = dVar1;
  (destination->m_CamY).z = (this->m_CamY).z;
  dVar1 = (this->m_CamY).y;
  (destination->m_CamY).x = (this->m_CamY).x;
  (destination->m_CamY).y = dVar1;
  (destination->m_CamZ).z = (this->m_CamZ).z;
  dVar1 = (this->m_CamZ).y;
  (destination->m_CamZ).x = (this->m_CamZ).x;
  (destination->m_CamZ).y = dVar1;
  destination->m_frus_left = this->m_frus_left;
  destination->m_frus_right = this->m_frus_right;
  destination->m_frus_bottom = this->m_frus_bottom;
  destination->m_frus_top = this->m_frus_top;
  destination->m_frus_near = this->m_frus_near;
  destination->m_frus_far = this->m_frus_far;
  destination->m_port_left = this->m_port_left;
  destination->m_port_right = this->m_port_right;
  destination->m_port_bottom = this->m_port_bottom;
  destination->m_port_top = this->m_port_top;
  destination->m_port_near = this->m_port_near;
  destination->m_port_far = this->m_port_far;
  dVar1 = (this->m_target_point).y;
  (destination->m_target_point).x = (this->m_target_point).x;
  (destination->m_target_point).y = dVar1;
  (destination->m_target_point).z = (this->m_target_point).z;
  uVar3 = (this->m_viewport_id).Data2;
  uVar4 = (this->m_viewport_id).Data3;
  uVar2 = *(undefined8 *)(this->m_viewport_id).Data4;
  (destination->m_viewport_id).Data1 = (this->m_viewport_id).Data1;
  (destination->m_viewport_id).Data2 = uVar3;
  (destination->m_viewport_id).Data3 = uVar4;
  *(undefined8 *)(destination->m_viewport_id).Data4 = uVar2;
  pOVar6 = &this->m_clip_mods;
  pOVar7 = &destination->m_clip_mods;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pOVar7->m_xform[0][0] = pOVar6->m_xform[0][0];
    pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
    pOVar7 = (ON_Xform *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  pOVar6 = &this->m_clip_mods_inverse;
  pOVar7 = &destination->m_clip_mods_inverse;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pOVar7->m_xform[0][0] = pOVar6->m_xform[0][0];
    pOVar6 = (ON_Xform *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
    pOVar7 = (ON_Xform *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  destination->m__MIN_NEAR_DIST = this->m__MIN_NEAR_DIST;
  destination->m__MIN_NEAR_OVER_FAR = this->m__MIN_NEAR_OVER_FAR;
  return destination;
}

Assistant:

ON_Viewport* ON_Viewport::ShallowCopy(ON_Viewport* destination) const
{
  if (nullptr == destination)
    destination = new ON_Viewport();
  else
  {
    destination->PurgeUserData();
    if (this == destination)
      return destination; // The caller is probably confused but this is what they should get.
    *destination = ON_Viewport::DefaultTopViewYUp; // default ctor values
  }

#define ON_INTERNAL_SHALLOW_FIELD_COPY(field) destination->field = this->field
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidCamera);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidFrustum);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidPort);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidCameraFrame);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_projection);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamUp);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamDir);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamLoc);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frustum_symmetry_flags);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamLoc);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamDir);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamUp);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamX);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamY);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamZ);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_left);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_right);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_bottom);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_top);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_near);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_far);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_left);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_right);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_bottom);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_top);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_near);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_far);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_target_point);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_viewport_id);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_clip_mods);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_clip_mods_inverse);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m__MIN_NEAR_DIST);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m__MIN_NEAR_OVER_FAR);
#undef ON_INTERNAL_SHALLOW_COPY
  return destination;
}